

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DPIExportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIExportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,Token *args_6,
          Token *args_7)

{
  Info *pIVar1;
  Info *pIVar2;
  size_t sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  Info *pIVar9;
  SyntaxNode *pSVar10;
  undefined4 uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  TokenKind TVar20;
  undefined1 uVar21;
  NumericTokenFlags NVar22;
  uint32_t uVar23;
  TokenKind TVar24;
  undefined1 uVar25;
  NumericTokenFlags NVar26;
  uint32_t uVar27;
  TokenKind TVar28;
  undefined1 uVar29;
  NumericTokenFlags NVar30;
  uint32_t uVar31;
  TokenKind TVar32;
  undefined1 uVar33;
  NumericTokenFlags NVar34;
  uint32_t uVar35;
  TokenKind TVar36;
  undefined1 uVar37;
  NumericTokenFlags NVar38;
  uint32_t uVar39;
  DPIExportSyntax *pDVar40;
  long lVar41;
  
  pDVar40 = (DPIExportSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DPIExportSyntax *)this->endPtr < pDVar40 + 1) {
    pDVar40 = (DPIExportSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(pDVar40 + 1);
  }
  TVar12 = args_1->kind;
  uVar13 = args_1->field_0x2;
  NVar14.raw = (args_1->numFlags).raw;
  uVar15 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar16 = args_2->kind;
  uVar17 = args_2->field_0x2;
  NVar18.raw = (args_2->numFlags).raw;
  uVar19 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar20 = args_3->kind;
  uVar21 = args_3->field_0x2;
  NVar22.raw = (args_3->numFlags).raw;
  uVar23 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar24 = args_4->kind;
  uVar25 = args_4->field_0x2;
  NVar26.raw = (args_4->numFlags).raw;
  uVar27 = args_4->rawLen;
  pIVar6 = args_4->info;
  TVar28 = args_5->kind;
  uVar29 = args_5->field_0x2;
  NVar30.raw = (args_5->numFlags).raw;
  uVar31 = args_5->rawLen;
  pIVar7 = args_5->info;
  TVar32 = args_6->kind;
  uVar33 = args_6->field_0x2;
  NVar34.raw = (args_6->numFlags).raw;
  uVar35 = args_6->rawLen;
  pIVar8 = args_6->info;
  TVar36 = args_7->kind;
  uVar37 = args_7->field_0x2;
  NVar38.raw = (args_7->numFlags).raw;
  uVar39 = args_7->rawLen;
  pIVar9 = args_7->info;
  (pDVar40->super_MemberSyntax).super_SyntaxNode.kind = DPIExport;
  (pDVar40->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar40->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar11 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar10 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar11;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar10;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pDVar40->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pDVar40->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f75e8;
  (pDVar40->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pDVar40;
  sVar3 = (pDVar40->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar3 != 0) {
    ppAVar4 = (pDVar40->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar41 = 0;
    do {
      *(DPIExportSyntax **)(*(long *)((long)ppAVar4 + lVar41) + 8) = pDVar40;
      lVar41 = lVar41 + 8;
    } while (sVar3 << 3 != lVar41);
  }
  (pDVar40->keyword).kind = TVar12;
  (pDVar40->keyword).field_0x2 = uVar13;
  (pDVar40->keyword).numFlags = (NumericTokenFlags)NVar14.raw;
  (pDVar40->keyword).rawLen = uVar15;
  (pDVar40->keyword).info = pIVar1;
  (pDVar40->specString).kind = TVar16;
  (pDVar40->specString).field_0x2 = uVar17;
  (pDVar40->specString).numFlags = (NumericTokenFlags)NVar18.raw;
  (pDVar40->specString).rawLen = uVar19;
  (pDVar40->specString).info = pIVar2;
  (pDVar40->c_identifier).kind = TVar20;
  (pDVar40->c_identifier).field_0x2 = uVar21;
  (pDVar40->c_identifier).numFlags = (NumericTokenFlags)NVar22.raw;
  (pDVar40->c_identifier).rawLen = uVar23;
  (pDVar40->c_identifier).info = pIVar5;
  (pDVar40->equals).kind = TVar24;
  (pDVar40->equals).field_0x2 = uVar25;
  (pDVar40->equals).numFlags = (NumericTokenFlags)NVar26.raw;
  (pDVar40->equals).rawLen = uVar27;
  (pDVar40->equals).info = pIVar6;
  (pDVar40->functionOrTask).kind = TVar28;
  (pDVar40->functionOrTask).field_0x2 = uVar29;
  (pDVar40->functionOrTask).numFlags = (NumericTokenFlags)NVar30.raw;
  (pDVar40->functionOrTask).rawLen = uVar31;
  (pDVar40->functionOrTask).info = pIVar7;
  (pDVar40->name).kind = TVar32;
  (pDVar40->name).field_0x2 = uVar33;
  (pDVar40->name).numFlags = (NumericTokenFlags)NVar34.raw;
  (pDVar40->name).rawLen = uVar35;
  (pDVar40->name).info = pIVar8;
  (pDVar40->semi).kind = TVar36;
  (pDVar40->semi).field_0x2 = uVar37;
  (pDVar40->semi).numFlags = (NumericTokenFlags)NVar38.raw;
  (pDVar40->semi).rawLen = uVar39;
  (pDVar40->semi).info = pIVar9;
  return pDVar40;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }